

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O3

void __thiscall senjo::UCIAdapter::GoCommand(UCIAdapter *this,char *params)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  BackgroundCommand *this_00;
  Output local_50;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  this_00 = (BackgroundCommand *)operator_new(0x50);
  this_00->engine = this->engine;
  this_00->_vptr_BackgroundCommand = (_func_int **)&PTR__BackgroundCommand_0015bbc0;
  sVar1 = DAT_001b07b8;
  if (((params == (char *)0x0 || DAT_001b07b8 == 0) ||
      (iVar3 = strncmp(params,token::Help_abi_cxx11_,DAT_001b07b8), iVar3 != 0)) ||
     ((params[sVar1] != '\0' && (iVar3 = isspace((int)params[sVar1]), iVar3 == 0)))) {
    bVar2 = BackgroundCommand::ParseAndExecute(this_00,params,&this->thread);
    if (bVar2) {
      return;
    }
  }
  else {
    Output::Output(&local_50,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
    (*this_00->_vptr_BackgroundCommand[3])(&local_48,this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_48,local_40);
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
    Output::~Output(&local_50);
    Output::Output(&local_50,InfoPrefix);
    (*this_00->_vptr_BackgroundCommand[4])(&local_48,this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_48,local_40);
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
    Output::~Output(&local_50);
  }
  (*this_00->_vptr_BackgroundCommand[1])(this_00);
  return;
}

Assistant:

void UCIAdapter::GoCommand(const char* params)
{
  GoCommandHandle* handle = new GoCommandHandle(engine);
  if (!handle) {
    Output() << "Out of memory";
    return;
  }

  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << handle->Usage();
    Output() << handle->Description();
  }
  else if (handle->ParseAndExecute(params, thread)) {
    return;
  }

  delete handle;
  handle = NULL;
}